

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorManager.cpp
# Opt level: O2

shared_ptr<Detector> __thiscall
DetectorManager::createDetector(DetectorManager *this,string *detectorName)

{
  iterator iVar1;
  Detector *__p;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<Detector> sVar3;
  shared_ptr<Detector> detector;
  long local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
                  *)detectorName,in_RDX);
  if (((_Base_ptr)&detectorName->_M_string_length == iVar1._M_node) ||
     (*(long **)(iVar1._M_node + 2) == (long *)0x0)) {
    *(undefined8 *)&(this->m_detectors)._M_t._M_impl = 0;
    *(undefined8 *)&(this->m_detectors)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    __p = (Detector *)(**(code **)(**(long **)(iVar1._M_node + 2) + 0x10))();
    std::__shared_ptr<Detector,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Detector,void>
              ((__shared_ptr<Detector,(__gnu_cxx::_Lock_policy)2> *)&local_20,__p);
    _Var2._M_pi = local_18._M_pi;
    if (local_20 == 0) {
      *(undefined8 *)&(this->m_detectors)._M_t._M_impl = 0;
      *(undefined8 *)&(this->m_detectors)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    }
    else {
      *(long *)&(this->m_detectors)._M_t._M_impl = local_20;
      local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       &(this->m_detectors)._M_t._M_impl.super__Rb_tree_header._M_header = _Var2._M_pi;
      local_20 = 0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<Detector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Detector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Detector>)sVar3.super___shared_ptr<Detector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Detector> DetectorManager::createDetector(const std::string& detectorName) 
{
	auto it = m_detectors.find(detectorName);
	if (m_detectors.end() == it) 
	{
		return nullptr;
	}

	auto& detectorLauncher = it->second;
	if (!detectorLauncher) 
	{
		return nullptr;
	}

	auto detector = std::shared_ptr<Detector>(detectorLauncher->create());
	if (!detector) 
	{
		return nullptr;
	}

	return detector;
}